

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
__thiscall
duckdb::BindContext::PositionToColumn(BindContext *this,PositionalReferenceExpression *ref)

{
  BinderException *this_00;
  PositionalReferenceExpression *in_RDX;
  string error;
  string column_name;
  string table_name;
  string local_80;
  string local_60;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  BindColumn(&local_80,(BindContext *)ref,in_RDX,&local_40,&local_60);
  if (local_80._M_string_length == 0) {
    make_uniq<duckdb::ColumnRefExpression,std::__cxx11::string&,std::__cxx11::string&>
              ((duckdb *)this,&local_60,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    return (unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>_>
            )(unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>_>
              )this;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  BinderException::BinderException(this_00,&local_80);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ColumnRefExpression> BindContext::PositionToColumn(PositionalReferenceExpression &ref) {
	string table_name, column_name;

	string error = BindColumn(ref, table_name, column_name);
	if (!error.empty()) {
		throw BinderException(error);
	}
	return make_uniq<ColumnRefExpression>(column_name, table_name);
}